

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O2

value_type __thiscall
protozero::
iterator_range<protozero::const_varint_iterator<long>,_std::pair<protozero::const_varint_iterator<long>,_protozero::const_varint_iterator<long>_>_>
::front(iterator_range<protozero::const_varint_iterator<long>,_std::pair<protozero::const_varint_iterator<long>,_protozero::const_varint_iterator<long>_>_>
        *this)

{
  undefined4 in_EAX;
  int iVar1;
  value_type_conflict3 vVar2;
  assert_error *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar4._0_4_ = -(uint)(*(int *)&(this->
                                  super_pair<protozero::const_varint_iterator<long>,_protozero::const_varint_iterator<long>_>
                                  ).second.m_data ==
                        *(int *)&(this->
                                 super_pair<protozero::const_varint_iterator<long>,_protozero::const_varint_iterator<long>_>
                                 ).first.m_data);
  auVar4._4_4_ = -(uint)(*(int *)((long)&(this->
                                         super_pair<protozero::const_varint_iterator<long>,_protozero::const_varint_iterator<long>_>
                                         ).second.m_data + 4) ==
                        *(int *)((long)&(this->
                                        super_pair<protozero::const_varint_iterator<long>,_protozero::const_varint_iterator<long>_>
                                        ).first.m_data + 4));
  auVar4._8_4_ = -(uint)(*(int *)&(this->
                                  super_pair<protozero::const_varint_iterator<long>,_protozero::const_varint_iterator<long>_>
                                  ).second.m_end ==
                        *(int *)&(this->
                                 super_pair<protozero::const_varint_iterator<long>,_protozero::const_varint_iterator<long>_>
                                 ).first.m_end);
  auVar4._12_4_ =
       -(uint)(*(int *)((long)&(this->
                               super_pair<protozero::const_varint_iterator<long>,_protozero::const_varint_iterator<long>_>
                               ).second.m_end + 4) ==
              *(int *)((long)&(this->
                              super_pair<protozero::const_varint_iterator<long>,_protozero::const_varint_iterator<long>_>
                              ).first.m_end + 4));
  auVar3._4_4_ = auVar4._0_4_;
  auVar3._0_4_ = auVar4._4_4_;
  auVar3._8_4_ = auVar4._12_4_;
  auVar3._12_4_ = auVar4._8_4_;
  iVar1 = movmskpd(in_EAX,auVar3 & auVar4);
  if (iVar1 != 3) {
    vVar2 = const_varint_iterator<long>::operator*((const_varint_iterator<long> *)this);
    return vVar2;
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10);
  assert_error::assert_error(this_00,"!empty()");
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

constexpr iterator begin() const noexcept {
        return this->first;
    }